

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void shift_rows(uint32_t *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = *state;
  uVar4 = state[1];
  uVar1 = state[3];
  uVar2 = state[2];
  *state = uVar2 & 0xff00 | uVar1 & 0xff | uVar3 & 0xff000000 | uVar4 & 0xff0000;
  state[1] = uVar2 & 0xff0000 | uVar1 & 0xff00 | uVar4 & 0xff000000 | uVar3 & 0xff;
  state[2] = uVar2 & 0xff000000 | uVar1 & 0xff0000 | uVar3 & 0xff00 | uVar4 & 0xff;
  state[3] = uVar2 & 0xff | uVar1 & 0xff000000 | uVar4 & 0xff00 | uVar3 & 0xff0000;
  return;
}

Assistant:

static void shift_rows(uint32_t state[4])
{
  uint32_t u, v, x, y;

  u = word4(byte(state[0], 0),
            byte(state[1], 1),
            byte(state[2], 2),
            byte(state[3], 3));

  v = word4(byte(state[1], 0),
            byte(state[2], 1),
            byte(state[3], 2),
            byte(state[0], 3));

  x = word4(byte(state[2], 0),
            byte(state[3], 1),
            byte(state[0], 2),
            byte(state[1], 3));

  y = word4(byte(state[3], 0),
            byte(state[0], 1),
            byte(state[1], 2),
            byte(state[2], 3));

  state[0] = u;
  state[1] = v;
  state[2] = x;
  state[3] = y;
}